

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linalg.h
# Opt level: O2

void gmath::svd<double,3,3>
               (SMatrix<double,_3,_3> *a,SMatrix<double,_3,_3> *u,SVector<double,_3> *w,
               SMatrix<double,_3,_3> *v)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  Vectord W;
  Matrixd V;
  Matrixd U;
  SMatrix<double,_3,_3> local_68;
  
  DMatrix<double>::DMatrix(&U,0,0);
  DMatrix<double>::DMatrix(&V,0,0);
  DVector<double>::DVector(&W,0);
  DMatrix<double>::DMatrix<double,3,3>((DMatrix<double> *)&local_68,a);
  svd((Matrixd *)&local_68,&U,&W,&V,false);
  DMatrix<double>::~DMatrix((DMatrix<double> *)&local_68);
  DMatrix::operator_cast_to_SMatrix(&local_68,(DMatrix *)&U);
  SMatrix<double,_3,_3>::operator=(u,&local_68);
  DMatrix::operator_cast_to_SMatrix(&local_68,(DMatrix *)&V);
  SMatrix<double,_3,_3>::operator=(v,&local_68);
  uVar2 = 3;
  if (W.n < 3) {
    uVar2 = W.n;
  }
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    w->v[uVar4] = W.v[uVar4];
  }
  uVar2 = 3;
  if (W.n < 3) {
    uVar2 = W.n;
  }
  for (lVar1 = (long)(int)uVar2; (int)lVar1 != 3; lVar1 = lVar1 + 1) {
    w->v[lVar1] = 0.0;
  }
  DVector<double>::~DVector(&W);
  DMatrix<double>::~DMatrix(&V);
  DMatrix<double>::~DMatrix(&U);
  return;
}

Assistant:

inline void svd(const SMatrix<T, m, n> &a,
    SMatrix<T, m, m> &u, SVector<T, n> &w, SMatrix<T, n, n> &v)
{
  Matrixd U, V;
  Vectord W;

  svd(a, U, W, V, false);
  u=U; v=V;

  int nn=std::min(w.size(), W.size());

  for (int i=0; i<nn; i++)
  {
    w[i]=W[i];
  }

  for (int i=nn; i < w.size(); i++)
  {
    w[i]=0;
  }
}